

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::InternalException::InternalException<int,unsigned_long,unsigned_long>
          (InternalException *this,string *msg,int params,unsigned_long params_1,
          unsigned_long params_2)

{
  undefined4 in_register_00000014;
  unsigned_long in_R9;
  string local_30;
  
  Exception::ConstructMessage<int,unsigned_long,unsigned_long>
            (&local_30,(Exception *)msg,(string *)CONCAT44(in_register_00000014,params),
             (int)params_1,params_2,in_R9);
  InternalException(this,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}